

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileURL.cpp
# Opt level: O2

string * __thiscall FileURL::ToString_abi_cxx11_(string *__return_storage_ptr__,FileURL *this)

{
  ostream *poVar1;
  _List_node_base *p_Var2;
  stringstream pathStream;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  if (this->mIsAbsolute == true) {
    std::operator<<(local_1a0,"file:///");
  }
  if ((this->mPathComponents).
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size != 0) {
    p_Var2 = (this->mPathComponents).
             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    std::operator<<(local_1a0,(string *)(p_Var2 + 1));
    while (p_Var2 = p_Var2->_M_next, p_Var2 != (_List_node_base *)&this->mPathComponents) {
      poVar1 = std::operator<<(local_1a0,"/");
      std::operator<<(poVar1,(string *)(p_Var2 + 1));
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

string FileURL::ToString() const
{
	stringstream pathStream;
    
	if(mIsAbsolute)
		pathStream<<"file:///";
    
	if(mPathComponents.size() > 0)
	{
		StringList::const_iterator it = mPathComponents.begin();
		pathStream<<*it;
		++it;
        
		for(; it != mPathComponents.end();++it)
			pathStream<<"/"<<*it;
	}
    
	return pathStream.str();
}